

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::LogToStderr(void)

{
  int i;
  LogSeverity severity;
  
  SetStderrLogging(GLOG_INFO);
  for (severity = GLOG_INFO; severity != 4; severity = severity + GLOG_WARNING) {
    SetLogDestination(severity,"");
  }
  return;
}

Assistant:

inline void LogDestination::LogToStderr() {
  // *Don't* put this stuff in a mutex lock, since SetStderrLogging &
  // SetLogDestination already do the locking!
  SetStderrLogging(GLOG_INFO);  // thus everything is "also" logged to stderr
  for (int i = 0; i < NUM_SEVERITIES; ++i) {
    SetLogDestination(static_cast<LogSeverity>(i),
                      "");  // "" turns off logging to a logfile
  }
}